

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transport.cpp
# Opt level: O3

void __thiscall
adios2::Transport::Transport(Transport *this,string *type,string *library,Comm *comm)

{
  pointer pcVar1;
  
  this->_vptr_Transport = (_func_int **)&PTR__Transport_00873538;
  (this->m_Type)._M_dataplus._M_p = (pointer)&(this->m_Type).field_2;
  pcVar1 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_Type,pcVar1,pcVar1 + type->_M_string_length);
  (this->m_Library)._M_dataplus._M_p = (pointer)&(this->m_Library).field_2;
  pcVar1 = (library->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_Library,pcVar1,pcVar1 + library->_M_string_length);
  (this->m_Name)._M_dataplus._M_p = (pointer)&(this->m_Name).field_2;
  (this->m_Name)._M_string_length = 0;
  (this->m_Name).field_2._M_local_buf[0] = '\0';
  this->m_OpenMode = Undefined;
  this->m_IsOpen = false;
  this->m_Comm = comm;
  (this->m_Profiler).m_Timers._M_h._M_buckets = &(this->m_Profiler).m_Timers._M_h._M_single_bucket;
  (this->m_Profiler).m_Timers._M_h._M_bucket_count = 1;
  (this->m_Profiler).m_Timers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_Profiler).m_Timers._M_h._M_element_count = 0;
  (this->m_Profiler).m_Timers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_Profiler).m_Timers._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_Profiler).m_Timers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_Profiler).m_Bytes._M_h._M_buckets = &(this->m_Profiler).m_Bytes._M_h._M_single_bucket;
  (this->m_Profiler).m_Bytes._M_h._M_bucket_count = 1;
  (this->m_Profiler).m_Bytes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_Profiler).m_Bytes._M_h._M_element_count = 0;
  (this->m_Profiler).m_Bytes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_Profiler).m_Bytes._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_Profiler).m_Bytes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_Profiler).m_IsActive = false;
  return;
}

Assistant:

Transport::Transport(const std::string type, const std::string library, helper::Comm const &comm)
: m_Type(type), m_Library(library), m_Comm(comm)
{
}